

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

uint CountArguments(ParseNode *pnode,BOOL *pSideEffect)

{
  code *pcVar1;
  OpCode OVar2;
  bool bVar3;
  uint uVar4;
  ParseNodeBin *pPVar5;
  undefined4 *puVar6;
  uint uVar7;
  
  if (pSideEffect != (BOOL *)0x0) {
    *pSideEffect = 0;
  }
  if (pnode == (ParseNode *)0x0) {
    uVar7 = 1;
  }
  else {
    uVar7 = 2;
    OVar2 = pnode->nop;
    while (OVar2 == knopList) {
      if (pSideEffect != (BOOL *)0x0) {
        pPVar5 = ParseNode::AsParseNodeBin(pnode);
        uVar4 = ParseNode::Grfnop((uint)pPVar5->pnode1->nop);
        if ((uVar4 & 2) == 0) {
          *pSideEffect = 1;
        }
      }
      pPVar5 = ParseNode::AsParseNodeBin(pnode);
      pnode = pPVar5->pnode2;
      uVar7 = uVar7 + 1;
      OVar2 = pnode->nop;
    }
    if (pSideEffect != (BOOL *)0x0) {
      uVar4 = ParseNode::Grfnop((uint)OVar2);
      if ((uVar4 & 2) == 0) {
        *pSideEffect = 1;
      }
    }
    if (0xfffe < uVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x1773,"(argCount < Js::Constants::UShortMaxValue)",
                         "Number of allowed arguments are already capped at parser level");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
  }
  return uVar7;
}

Assistant:

unsigned int CountArguments(ParseNode *pnode, BOOL *pSideEffect = nullptr)
{
    // If the caller passed us a pSideEffect, it wants to know whether there are potential
    // side-effects in the argument list. We need to know this so that the call target
    // operands can be preserved if necessary.
    // For now, treat any non-leaf op as a potential side-effect. This causes no detectable slowdowns,
    // but we can be more precise if we need to be.
    if (pSideEffect)
    {
        *pSideEffect = FALSE;
    }

    unsigned int argCount = 1;
    if (pnode != nullptr)
    {
        while (pnode->nop == knopList)
        {
            argCount++;
            if (pSideEffect && !(ParseNode::Grfnop(pnode->AsParseNodeBin()->pnode1->nop) & fnopLeaf))
            {
                *pSideEffect = TRUE;
            }
            pnode = pnode->AsParseNodeBin()->pnode2;
        }
        argCount++;
        if (pSideEffect && !(ParseNode::Grfnop(pnode->nop) & fnopLeaf))
        {
            *pSideEffect = TRUE;
        }
    }

    AssertOrFailFastMsg(argCount < Js::Constants::UShortMaxValue, "Number of allowed arguments are already capped at parser level");

    return argCount;
}